

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::arg_info,true,false>::
freeLinkedList<depspawn::internal::Workitem::finish_execution()::__0>
          (LinkedListPool<depspawn::internal::arg_info,_true,_false> *this,arg_info *datain,
          anon_class_1_0_00000001 *f)

{
  undefined8 in_RDX;
  arg_info *in_RSI;
  arg_info *in_RDI;
  LinkedListPool<depspawn::internal::arg_info,_true,_false> *unaff_retaddr;
  arg_info *p;
  arg_info *last_datain;
  arg_info *datain_00;
  
  last_datain = in_RSI;
  datain_00 = in_RDI;
  while (depspawn::internal::Workitem::finish_execution::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)in_RSI,in_RDI), in_RSI->next != (arg_info *)0x0) {
    in_RSI = in_RSI->next;
  }
  LinkedListPool<depspawn::internal::arg_info,_true,_false>::freeLinkedList
            (unaff_retaddr,datain_00,last_datain,SUB81((ulong)in_RDX >> 0x38,0));
  return;
}

Assistant:

void freeLinkedList(T* const datain, F&& f)
  {
    T* p = datain;
    
    do {

      f(p);

      if (!ALLOC_ONCE) {
        p->~T();
      }

      if (p->next == nullptr) {
        break;
      } else {
        p = static_cast<T *>(p->next);
      }
      
    } while (1);
    
    freeLinkedList(datain, p, true);
  }